

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O1

void ReadSigNetArgs(ArgsManager *args,SigNetOptions *options)

{
  pointer puVar1;
  bool bVar2;
  runtime_error *prVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  long in_FS_OFFSET;
  string_view str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  signet_challenge;
  optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> val;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  string local_68;
  undefined1 local_48 [32];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = local_48 + 0x10;
  local_48._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"-signetseednode","");
  bVar2 = ArgsManager::IsArgSet(args,(string *)local_48);
  if ((pointer)local_48._0_8_ != puVar1) {
    operator_delete((void *)local_48._0_8_,local_48._16_8_ + 1);
  }
  if (bVar2) {
    local_48._0_8_ = puVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"-signetseednode","");
    ArgsManager::GetArgs
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_68,args,(string *)local_48);
    if ((options->seeds).
        super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_engaged == true) {
      (options->seeds).
      super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_engaged = false;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&options->seeds);
    }
    *(pointer *)
     &(options->seeds).
      super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_payload._M_value.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl = local_68._M_dataplus._M_p;
    *(size_type *)
     ((long)&(options->seeds).
             super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_payload._M_value.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     + 8) = local_68._M_string_length;
    *(size_type *)
     ((long)&(options->seeds).
             super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_payload._M_value.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     + 0x10) = local_68.field_2._M_allocated_capacity;
    local_68._M_dataplus._M_p = (pointer)0x0;
    local_68._M_string_length = 0;
    local_68.field_2._M_allocated_capacity = 0;
    (options->seeds).
    super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_engaged = true;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_68);
    if ((pointer)local_48._0_8_ != puVar1) {
      operator_delete((void *)local_48._0_8_,local_48._16_8_ + 1);
    }
  }
  local_48._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"-signetchallenge","");
  bVar2 = ArgsManager::IsArgSet(args,(string *)local_48);
  if ((pointer)local_48._0_8_ != puVar1) {
    operator_delete((void *)local_48._0_8_,local_48._16_8_ + 1);
  }
  if (bVar2) {
    local_48._0_8_ = puVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"-signetchallenge","");
    ArgsManager::GetArgs(&local_80,args,(string *)local_48);
    if ((pointer)local_48._0_8_ != puVar1) {
      operator_delete((void *)local_48._0_8_,local_48._16_8_ + 1);
    }
    args_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)local_80.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_80.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    if (args_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x20) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"-signetchallenge cannot be multiple values.");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_0066ef8f;
    }
    str._M_str = ((local_80.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    str._M_len = (local_80.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    TryParseHex<unsigned_char>
              ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)local_48,str
              );
    if (local_48[0x18] == '\0') {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      tinyformat::format<std::__cxx11::string>
                (&local_68,(tinyformat *)"-signetchallenge must be hex, not \'%s\'.",
                 (char *)local_80.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,args_00);
      std::runtime_error::runtime_error(prVar3,(string *)&local_68);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_0066ef8f;
    }
    std::optional<std::vector<unsigned_char,std::allocator<unsigned_char>>>::
    emplace<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
              ((optional<std::vector<unsigned_char,std::allocator<unsigned_char>>> *)options,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
    if (local_48[0x18] == '\x01') {
      local_48[0x18] = '\0';
      if ((pointer)local_48._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_48._0_8_,local_48._16_8_ - local_48._0_8_);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_80);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_0066ef8f:
  __stack_chk_fail();
}

Assistant:

void ReadSigNetArgs(const ArgsManager& args, CChainParams::SigNetOptions& options)
{
    if (args.IsArgSet("-signetseednode")) {
        options.seeds.emplace(args.GetArgs("-signetseednode"));
    }
    if (args.IsArgSet("-signetchallenge")) {
        const auto signet_challenge = args.GetArgs("-signetchallenge");
        if (signet_challenge.size() != 1) {
            throw std::runtime_error("-signetchallenge cannot be multiple values.");
        }
        const auto val{TryParseHex<uint8_t>(signet_challenge[0])};
        if (!val) {
            throw std::runtime_error(strprintf("-signetchallenge must be hex, not '%s'.", signet_challenge[0]));
        }
        options.challenge.emplace(*val);
    }
}